

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O0

int bip32_key_from_parent_path
              (ext_key *hdkey,uint32_t *child_path,size_t child_path_len,uint32_t flags,
              ext_key *key_out)

{
  long lVar1;
  ext_key *derived;
  long lStack_1d8;
  int ret;
  size_t tmp_idx;
  size_t i;
  ext_key tmp [2];
  uint local_3c;
  uint32_t derivation_flags;
  ext_key *key_out_local;
  uint32_t flags_local;
  size_t child_path_len_local;
  uint32_t *child_path_local;
  ext_key *hdkey_local;
  
  local_3c = flags | 2;
  lStack_1d8 = 0;
  if ((flags & 0xfffffff8) == 0) {
    if ((((hdkey == (ext_key *)0x0) || (child_path == (uint32_t *)0x0)) || (child_path_len == 0)) ||
       (key_out == (ext_key *)0x0)) {
      hdkey_local._4_4_ = -2;
    }
    else {
      child_path_local = (uint32_t *)hdkey;
      for (tmp_idx = 0; tmp_idx < child_path_len; tmp_idx = tmp_idx + 1) {
        lVar1 = lStack_1d8 + -1;
        if ((flags & 4) != 0) {
          *(undefined8 *)(tmp[lStack_1d8].pub_key + 0x19) = *(undefined8 *)(child_path_local + 0x28)
          ;
          *(undefined8 *)tmp[lStack_1d8].pub_key_tweak_sum =
               *(undefined8 *)(child_path_local + 0x2a);
          *(undefined8 *)(tmp[lStack_1d8].pub_key_tweak_sum + 8) =
               *(undefined8 *)(child_path_local + 0x2c);
          *(undefined8 *)(tmp[lStack_1d8].pub_key_tweak_sum + 0x10) =
               *(undefined8 *)(child_path_local + 0x2e);
        }
        if (child_path_len <= tmp_idx + 2) {
          local_3c = flags;
        }
        derived._4_4_ =
             bip32_key_from_parent
                       ((ext_key *)child_path_local,child_path[tmp_idx],local_3c,
                        (ext_key *)(tmp[lVar1].pub_key_tweak_sum + 0x18));
        if (derived._4_4_ != 0) break;
        lStack_1d8 = (long)(int)(uint)((lStack_1d8 != 0 ^ 0xffU) & 1);
        child_path_local = (uint32_t *)(tmp[lVar1].pub_key_tweak_sum + 0x18);
      }
      if (derived._4_4_ == 0) {
        memcpy(key_out,child_path_local,0xc0);
      }
      wally_clear(&i,0x180);
      hdkey_local._4_4_ = derived._4_4_;
    }
  }
  else {
    hdkey_local._4_4_ = -2;
  }
  return hdkey_local._4_4_;
}

Assistant:

int bip32_key_from_parent_path(const struct ext_key *hdkey,
                               const uint32_t *child_path, size_t child_path_len,
                               uint32_t flags, struct ext_key *key_out)
{
    /* Optimization: We can skip hash calculations for internal nodes */
    uint32_t derivation_flags = flags | BIP32_FLAG_SKIP_HASH;
    struct ext_key tmp[2];
    size_t i, tmp_idx = 0;
    int ret;

    if (flags & ~BIP32_ALL_DEFINED_FLAGS)
        return WALLY_EINVAL; /* These flags are not defined yet */

    if (!hdkey || !child_path || !child_path_len || !key_out)
        return WALLY_EINVAL;

    for (i = 0; i < child_path_len; ++i) {
        struct ext_key *derived = &tmp[tmp_idx];
#ifdef BUILD_ELEMENTS
        if (flags & BIP32_FLAG_KEY_TWEAK_SUM)
            memcpy(derived->pub_key_tweak_sum, hdkey->pub_key_tweak_sum, sizeof(hdkey->pub_key_tweak_sum));
#endif /* BUILD_ELEMENTS */
        if (i + 2 >= child_path_len)
            derivation_flags = flags; /* Use callers flags for the final derivations */
        ret = bip32_key_from_parent(hdkey, child_path[i], derivation_flags, derived);
        if (ret != WALLY_OK)
            break;

        hdkey = derived;    /* Derived becomes next parent */
        tmp_idx = !tmp_idx; /* Use free slot in tmp for next derived */
    }

    if (ret == WALLY_OK)
        memcpy(key_out, hdkey, sizeof(*key_out));

    wally_clear(tmp, sizeof(tmp));
    return ret;
}